

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O0

int run_test_loop_close(void)

{
  int iVar1;
  void *eval_b_6;
  void *eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  void *eval_b_4;
  void *eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t loop;
  int r;
  
  eval_a = (int64_t)&eval_a;
  iVar1 = uv_loop_init((uv_loop_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x26,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((int64_t *)eval_a != &eval_a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x27,"loop.data","==","(void*) &loop",eval_a,"==",&eval_a);
    abort();
  }
  uv_timer_init((uv_loop_t *)&eval_a,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  iVar1 = uv_loop_close((uv_loop_t *)&eval_a);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x2c,"UV_EBUSY","==","uv_loop_close(&loop)",0xfffffffffffffff0,"==",(long)iVar1);
    abort();
  }
  uv_run((uv_loop_t *)&eval_a,UV_RUN_DEFAULT);
  uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
  loop._804_4_ = uv_run((uv_loop_t *)&eval_a,UV_RUN_DEFAULT);
  if ((long)(int)loop._804_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x32,"r","==","0",(long)(int)loop._804_4_,"==",0);
    abort();
  }
  if ((int64_t *)eval_a != &eval_a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x34,"loop.data","==","(void*) &loop",eval_a,"==",&eval_a);
    abort();
  }
  iVar1 = uv_loop_close((uv_loop_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x35,"uv_loop_close(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((int64_t *)eval_a != &eval_a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
            ,0x36,"loop.data","==","(void*) &loop",eval_a,"==",&eval_a);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_close) {
  int r;
  uv_loop_t loop;

  loop.data = &loop;
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_PTR_EQ(loop.data, (void*) &loop);

  uv_timer_init(&loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  ASSERT_EQ(UV_EBUSY, uv_loop_close(&loop));

  uv_run(&loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  r = uv_run(&loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_PTR_EQ(loop.data, (void*) &loop);
  ASSERT_OK(uv_loop_close(&loop));
  ASSERT_PTR_EQ(loop.data, (void*) &loop);

  return 0;
}